

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::
InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::InlinedVector(InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this,InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *other)

{
  undefined8 uVar1;
  size_t sVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 *puVar5;
  
  (this->alloc).memoryResource = (other->alloc).memoryResource;
  this->ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  sVar2 = other->nStored;
  this->nAlloc = other->nAlloc;
  this->nStored = sVar2;
  this->ptr = other->ptr;
  if (other->nStored < 5) {
    if (other->nStored != 0) {
      puVar3 = (undefined8 *)((long)&other->field_2 + 0x10);
      puVar5 = (undefined8 *)((long)&this->field_2 + 0x10);
      uVar4 = 0;
      do {
        puVar5[-2] = puVar5;
        if (puVar3 == (undefined8 *)puVar3[-2]) {
          uVar1 = puVar3[1];
          *puVar5 = *puVar3;
          puVar5[1] = uVar1;
        }
        else {
          puVar5[-2] = (undefined8 *)puVar3[-2];
          *puVar5 = *puVar3;
        }
        puVar5[-1] = puVar3[-1];
        puVar3[-2] = puVar3;
        puVar3[-1] = 0;
        *(undefined1 *)puVar3 = 0;
        uVar4 = uVar4 + 1;
        puVar3 = puVar3 + 4;
        puVar5 = puVar5 + 4;
      } while (uVar4 < other->nStored);
    }
  }
  else {
    other->nStored = 0;
  }
  other->nAlloc = 0;
  other->ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  return;
}

Assistant:

InlinedVector(InlinedVector &&other) : alloc(other.alloc) {
        nStored = other.nStored;
        nAlloc = other.nAlloc;
        ptr = other.ptr;
        if (other.nStored <= N)
            for (int i = 0; i < other.nStored; ++i)
                alloc.template construct<T>(fixed + i, std::move(other.fixed[i]));
        // Leave other.nStored as is, so that the detrius left after we
        // moved out of fixed has its destructors run...
        else
            other.nStored = 0;

        other.nAlloc = 0;
        other.ptr = nullptr;
    }